

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InlinePass::MoveInstsBeforeEntryBlock
          (InlinePass *this,
          unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
          *preCallSB,BasicBlock *new_blk_ptr,iterator *call_inst_itr,
          UptrVectorIterator<spvtools::opt::BasicBlock,_false> call_block_itr)

{
  bool bVar1;
  type inst_00;
  pointer pIVar2;
  pointer this_00;
  mapped_type *ppIVar3;
  undefined1 local_70 [32];
  Instruction *sb_inst_ptr;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> cp_inst;
  Instruction *inst;
  iterator cii;
  iterator *call_inst_itr_local;
  BasicBlock *new_blk_ptr_local;
  unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  *preCallSB_local;
  InlinePass *this_local;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> call_block_itr_local;
  
  call_block_itr_local.container_ = (UptrVector *)call_block_itr.iterator_._M_current;
  this_local = (InlinePass *)call_block_itr.container_;
  cii.super_iterator.node_ = (iterator)(iterator)call_inst_itr;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
            ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&this_local);
  BasicBlock::begin((BasicBlock *)&inst);
  while (bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)&inst,
                                   &call_inst_itr->super_iterator), bVar1) {
    cp_inst._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*
                     ((iterator_template<spvtools::opt::Instruction> *)&inst);
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
              ((IntrusiveNodeBase<spvtools::opt::Instruction> *)
               cp_inst._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&sb_inst_ptr,
               (pointer)cp_inst._M_t.
                        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
    inst_00 = std::
              unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ::operator*((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                           *)&sb_inst_ptr);
    bVar1 = IsSameBlockOp(this,inst_00);
    if (bVar1) {
      pIVar2 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::get((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&sb_inst_ptr);
      local_70._24_8_ = pIVar2;
      this_00 = std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::operator->((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                              *)&sb_inst_ptr);
      local_70._20_4_ = Instruction::result_id(this_00);
      ppIVar3 = std::
                unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                ::operator[](preCallSB,(key_type *)(local_70 + 0x14));
      *ppIVar3 = pIVar2;
    }
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)(local_70 + 8),
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&sb_inst_ptr);
    BasicBlock::AddInstruction
              (new_blk_ptr,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)(local_70 + 8));
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 *)(local_70 + 8));
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 *)&sb_inst_ptr);
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&this_local);
    BasicBlock::begin((BasicBlock *)local_70);
    InstructionList::iterator::operator=((iterator *)&inst,(iterator *)local_70);
  }
  return;
}

Assistant:

void InlinePass::MoveInstsBeforeEntryBlock(
    std::unordered_map<uint32_t, Instruction*>* preCallSB,
    BasicBlock* new_blk_ptr, BasicBlock::iterator call_inst_itr,
    UptrVectorIterator<BasicBlock> call_block_itr) {
  for (auto cii = call_block_itr->begin(); cii != call_inst_itr;
       cii = call_block_itr->begin()) {
    Instruction* inst = &*cii;
    inst->RemoveFromList();
    std::unique_ptr<Instruction> cp_inst(inst);
    // Remember same-block ops for possible regeneration.
    if (IsSameBlockOp(&*cp_inst)) {
      auto* sb_inst_ptr = cp_inst.get();
      (*preCallSB)[cp_inst->result_id()] = sb_inst_ptr;
    }
    new_blk_ptr->AddInstruction(std::move(cp_inst));
  }
}